

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.c
# Opt level: O2

void cprint_lu_col(char *msg,int jcol,int pivrow,int_t *xprune,GlobalLU_t *Glu)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int_t *piVar4;
  int_t *piVar5;
  void *pvVar6;
  int_t *piVar7;
  void *pvVar8;
  int_t *piVar9;
  int_t *piVar10;
  long lVar11;
  long lVar12;
  
  piVar2 = Glu->xsup;
  piVar3 = Glu->supno;
  piVar4 = Glu->lsub;
  piVar5 = Glu->xlsub;
  pvVar6 = Glu->lusup;
  piVar7 = Glu->xlusup;
  pvVar8 = Glu->ucol;
  piVar9 = Glu->usub;
  piVar10 = Glu->xusub;
  printf("%s",msg);
  printf("col %d: pivrow %d, supno %d, xprune %lld\n",(ulong)(uint)jcol,pivrow,
         (ulong)(uint)piVar3[jcol],(long)xprune[jcol]);
  puts("\tU-col:");
  for (lVar12 = (long)piVar10[jcol]; lVar12 < piVar10[jcol + 1]; lVar12 = lVar12 + 1) {
    printf("\t%d%10.4f, %10.4f\n",(double)*(float *)((long)pvVar8 + lVar12 * 8),
           (double)*(float *)((long)pvVar8 + lVar12 * 8 + 4),(ulong)(uint)piVar9[lVar12]);
  }
  puts("\tL-col in rectangular snode:");
  iVar1 = piVar2[piVar3[jcol]];
  lVar11 = (long)piVar5[iVar1];
  for (lVar12 = (long)piVar7[jcol];
      (lVar11 < piVar5[(long)iVar1 + 1] && (lVar12 < piVar7[jcol + 1])); lVar12 = lVar12 + 1) {
    printf("\t%d\t%10.4f, %10.4f\n",(double)*(float *)((long)pvVar6 + lVar12 * 8),
           (double)*(float *)((long)pvVar6 + lVar12 * 8 + 4),(ulong)(uint)piVar4[lVar11]);
    lVar11 = lVar11 + 1;
  }
  fflush(_stdout);
  return;
}

Assistant:

void
cprint_lu_col(char *msg, int jcol, int pivrow, int_t *xprune, GlobalLU_t *Glu)
{
    int_t    i, k;
    int     *xsup, *supno, fsupc;
    int_t   *xlsub, *lsub;
    singlecomplex  *lusup;
    int_t   *xlusup;
    singlecomplex  *ucol;
    int_t   *usub, *xusub;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    ucol    = (singlecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    
    printf("%s", msg);
    printf("col %d: pivrow %d, supno %d, xprune %lld\n", 
	   jcol, pivrow, supno[jcol], (long long) xprune[jcol]);
    
    printf("\tU-col:\n");
    for (i = xusub[jcol]; i < xusub[jcol+1]; i++)
	printf("\t%d%10.4f, %10.4f\n", (int)usub[i], ucol[i].r, ucol[i].i);
    printf("\tL-col in rectangular snode:\n");
    fsupc = xsup[supno[jcol]];	/* first col of the snode */
    i = xlsub[fsupc];
    k = xlusup[jcol];
    while ( i < xlsub[fsupc+1] && k < xlusup[jcol+1] ) {
	printf("\t%d\t%10.4f, %10.4f\n", (int)lsub[i], lusup[k].r, lusup[k].i);
	i++; k++;
    }
    fflush(stdout);
}